

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG>::Pop
          (BGIP_SolverBranchAndBound<JointPolicyPureVectorForClusteredBG> *this,
          BGIP_BnB_NodePtr *node)

{
  E *this_00;
  
  if (((this->_m_openQueue->c).
       super__Vector_base<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->px == node->px) {
    std::
    priority_queue<boost::shared_ptr<BGIP_BnB_Node>,_std::vector<boost::shared_ptr<BGIP_BnB_Node>,_std::allocator<boost::shared_ptr<BGIP_BnB_Node>_>_>,_std::less<boost::shared_ptr<BGIP_BnB_Node>_>_>
    ::pop(this->_m_openQueue);
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"Node to be popped is not the one specified");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void Pop(BGIP_BnB_NodePtr node)
    {
        if(_m_openQueue->top()!=node)
            throw(E("Node to be popped is not the one specified"));

        _m_openQueue->pop();
    }